

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateTestRequest(Session *this,string *id)

{
  Header *header;
  undefined1 local_258 [8];
  TestReqID testReqID;
  allocator<char> local_1e9;
  STRING local_1e8;
  MsgType local_1c8;
  undefined1 local_170 [8];
  Message testRequest;
  string *id_local;
  Session *this_local;
  
  testRequest._336_8_ = id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"1",&local_1e9);
  MsgType::MsgType(&local_1c8,&local_1e8);
  newMessage((Message *)local_170,this,&local_1c8);
  MsgType::~MsgType(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  header = Message::getHeader((Message *)local_170);
  fill(this,header);
  TestReqID::TestReqID((TestReqID *)local_258,(STRING *)testRequest._336_8_);
  FieldMap::setField((FieldMap *)local_170,(FieldBase *)local_258,true);
  sendRaw(this,(Message *)local_170,0);
  TestReqID::~TestReqID((TestReqID *)local_258);
  Message::~Message((Message *)local_170);
  return;
}

Assistant:

void Session::generateTestRequest(const std::string &id) {
  Message testRequest = newMessage(MsgType(MsgType_TestRequest));

  fill(testRequest.getHeader());
  TestReqID testReqID(id);
  testRequest.setField(testReqID);

  sendRaw(testRequest);
}